

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O0

void __thiscall mkvmuxer::MasteringMetadata::~MasteringMetadata(MasteringMetadata *this)

{
  PrimaryChromaticity *pPVar1;
  long in_RDI;
  
  pPVar1 = *(PrimaryChromaticity **)(in_RDI + 8);
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = *(PrimaryChromaticity **)(in_RDI + 0x10);
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = *(PrimaryChromaticity **)(in_RDI + 0x18);
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = *(PrimaryChromaticity **)(in_RDI + 0x20);
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  return;
}

Assistant:

~MasteringMetadata() {
    delete r_;
    delete g_;
    delete b_;
    delete white_point_;
  }